

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_listener.c
# Opt level: O0

void ht_tcp_listener_callback(TEventPtr events,size_t size,HT_Boolean serialized,void *user_data)

{
  void *user_data_local;
  HT_Boolean serialized_local;
  size_t size_local;
  TEventPtr events_local;
  
  ht_tcp_listener_push_events((HT_TCPListener *)user_data,events,size,serialized);
  return;
}

Assistant:

void
ht_tcp_listener_callback(TEventPtr events, size_t size, HT_Boolean serialized, void* user_data)
{
    ht_tcp_listener_push_events((HT_TCPListener*)user_data, events, size, serialized);
}